

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_utils.c
# Opt level: O0

WORD32 ihevcd_get_tu_data_size(WORD32 num_luma_samples)

{
  int iVar1;
  WORD32 num_tu;
  WORD32 num_chroma_tu;
  WORD32 num_luma_tu;
  WORD32 num_ctb;
  WORD32 tu_data_size;
  WORD32 num_luma_samples_local;
  
  iVar1 = num_luma_samples / 0x10;
  return (num_luma_samples / 0x100 + 1) * 4 + iVar1 + (iVar1 + (iVar1 >> 1)) * 0x2a;
}

Assistant:

WORD32 ihevcd_get_tu_data_size(WORD32 num_luma_samples)
{


    WORD32 tu_data_size;
    WORD32 num_ctb;
    WORD32 num_luma_tu, num_chroma_tu, num_tu;
    num_ctb = num_luma_samples / (MIN_CTB_SIZE * MIN_CTB_SIZE);

    num_luma_tu = num_luma_samples / (MIN_TU_SIZE * MIN_TU_SIZE);
    num_chroma_tu = num_luma_tu >> 1;

    num_tu = num_luma_tu + num_chroma_tu;
    tu_data_size = 0;

    /* Size for storing tu_t start index each CTB */
    /* One extra entry is needed to compute number of TUs in the last CTB */
    tu_data_size += (num_ctb + 1) * sizeof(WORD32);

    /* Size for storing tu map */
    tu_data_size += num_luma_tu * sizeof(UWORD8);

    /* Size for storing tu_t for each TU */
    tu_data_size += num_tu * sizeof(tu_t);

    /* Size for storing number of coded subblocks and scan_idx for each TU */
    tu_data_size += num_tu * (sizeof(WORD8) + sizeof(WORD8));

    /* Size for storing coeff data for each TU */
    tu_data_size += num_tu * sizeof(tu_sblk_coeff_data_t);


    return tu_data_size;
}